

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

string * __thiscall
Catch::Matchers::StdString::CasedString::caseSensitivitySuffix_abi_cxx11_
          (string *__return_storage_ptr__,CasedString *this)

{
  allocator local_19;
  CasedString *local_18;
  CasedString *this_local;
  
  local_18 = this;
  this_local = (CasedString *)__return_storage_ptr__;
  if (this->m_caseSensitivity == No) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__," (case insensitive)",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CasedString::caseSensitivitySuffix() const {
            return m_caseSensitivity == CaseSensitive::No
                   ? " (case insensitive)"
                   : std::string();
        }